

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis,int limit)

{
  char *pcVar1;
  uint uVar2;
  
  if (limit != -1) {
    this->overall_limit_ = limit;
    pcVar1 = InitFrom(this,zcis);
    uVar2 = ((int)pcVar1 - (int)this->buffer_end_) + limit;
    this->limit_ = uVar2;
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar2 >> 0x1f & uVar2);
    return pcVar1;
  }
  pcVar1 = InitFrom(this,zcis);
  return pcVar1;
}

Assistant:

const char* InitFrom(io::ZeroCopyInputStream* zcis, int limit) {
    if (limit == -1) return InitFrom(zcis);
    overall_limit_ = limit;
    auto res = InitFrom(zcis);
    limit_ = limit - static_cast<int>(buffer_end_ - res);
    limit_end_ = buffer_end_ + (std::min)(0, limit_);
    return res;
  }